

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.hpp
# Opt level: O2

ArgIface * __thiscall Args::Arg::findArgument(Arg *this,String *name)

{
  bool bVar1;
  QArrayDataPointer<char16_t> QStack_38;
  
  bVar1 = details::isArgument(name);
  if (bVar1) {
    String::substr((String *)&QStack_38,name,2,-1);
    bVar1 = operator==((QString *)&QStack_38,&(this->m_name).m_str);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_38);
    if (bVar1) {
      return &this->super_ArgIface;
    }
  }
  bVar1 = details::isFlag(name);
  if (bVar1) {
    String::substr((String *)&QStack_38,name,1,-1);
    bVar1 = operator==((QString *)&QStack_38,&(this->m_flag).m_str);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_38);
    if (!bVar1) {
      this = (Arg *)0x0;
    }
  }
  else {
    this = (Arg *)0x0;
  }
  return &this->super_ArgIface;
}

Assistant:

ArgIface * findArgument(
		/*!
			Name of the argument. Can be for example "-t" or
			"--timeout".
		*/
		const String & name ) override
	{
		if( details::isArgument( name ) && name.substr( 2 ) == m_name )
			return this;
		else if( details::isFlag( name ) && name.substr( 1 ) == m_flag )
			return this;
		else
			return nullptr;
	}